

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  void *pvVar2;
  ostream *poVar3;
  double dVar4;
  Move move;
  NimState state;
  ComputeOptions player2_options;
  ComputeOptions player1_options;
  NimState in_stack_000001fc;
  ComputeOptions in_stack_00000210;
  int iVar5;
  NimState *in_stack_ffffffffffffff60;
  NimState *in_stack_ffffffffffffff68;
  int local_44;
  NimState local_40;
  ComputeOptions local_38;
  ComputeOptions local_20;
  int local_4;
  
  local_4 = 0;
  MCTS::ComputeOptions::ComputeOptions(&local_20);
  MCTS::ComputeOptions::ComputeOptions(&local_38);
  local_20.max_iterations = 100000;
  local_20.verbose = true;
  local_38.max_iterations = 10000;
  local_38.verbose = true;
  NimState::NimState(&local_40,0xf);
  while( true ) {
    bVar1 = NimState::has_moves(in_stack_ffffffffffffff60);
    iVar5 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"State: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar3,local_40.player_to_move);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    if (local_40.player_to_move == 1) {
      in_stack_ffffffffffffff68 = (NimState *)CONCAT71(local_20._17_7_,local_20.verbose);
      in_stack_ffffffffffffff60 = (NimState *)local_20.max_time;
      iVar5 = local_20.max_iterations;
      local_44 = MCTS::compute_move<NimState>(in_stack_000001fc,in_stack_00000210);
    }
    else {
      in_stack_ffffffffffffff68 = (NimState *)CONCAT71(local_38._17_7_,local_38.verbose);
      in_stack_ffffffffffffff60 = (NimState *)local_38.max_time;
      iVar5 = local_38.max_iterations;
      local_44 = MCTS::compute_move<NimState>(in_stack_000001fc,in_stack_00000210);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Best move: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar3,local_44);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    NimState::do_move(in_stack_ffffffffffffff60,iVar5);
  }
  dVar4 = NimState::get_result(in_stack_ffffffffffffff68,iVar5);
  if ((dVar4 != 1.0) || (NAN(dVar4))) {
    dVar4 = NimState::get_result(in_stack_ffffffffffffff68,iVar5);
    if ((dVar4 != 1.0) || (NAN(dVar4))) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Nobody wins!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Player 2 wins!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Player 1 wins!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return local_4;
}

Assistant:

int main()
{
	using namespace std;

	MCTS::ComputeOptions player1_options, player2_options;
	player1_options.max_iterations = 100000;
	player1_options.verbose = true;
	player2_options.max_iterations =  10000;
	player2_options.verbose = true;

	NimState state(15);
	while (state.has_moves()) {
		cout << "State: " << state.player_to_move << endl;
		NimState::Move move;
		if (state.player_to_move == 1) {
			move = MCTS::compute_move(state, player1_options);
		}
		else {
			move = MCTS::compute_move(state, player2_options);
		}

		cout << "Best move: " << move << endl;
		state.do_move(move);
	}
	if (state.get_result(2) == 1.0) {
		cout << "Player 1 wins!" << endl;
	}
	else if (state.get_result(1) == 1.0) {
		cout << "Player 2 wins!" << endl;
	}
	else {
		cout << "Nobody wins!" << endl;
	}
}